

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_13::NameResolver::ResolveLabelVar(NameResolver *this,Var *var)

{
  pointer pbVar1;
  __type _Var2;
  string *psVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (var->type_ != Name) {
    return;
  }
  uVar5 = (ulong)((long)(this->labels_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->labels_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar6 = uVar5 & 0xffffffff;
  iVar4 = (int)uVar5 + 1;
  do {
    uVar6 = uVar6 - 1;
    if ((int)(uint)uVar6 < 0) {
      psVar3 = Var::name_abi_cxx11_(var);
      PrintError(this,&var->loc,"undefined label variable \"%s\"",(psVar3->_M_dataplus)._M_p);
      return;
    }
    pbVar1 = (this->labels_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = Var::name_abi_cxx11_(var);
    _Var2 = std::operator==(pbVar1 + ((uint)uVar6 & 0x7fffffff),psVar3);
    iVar4 = iVar4 + -1;
  } while (!_Var2);
  Var::set_index(var,(int)((ulong)((long)(this->labels_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->labels_).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) - iVar4);
  return;
}

Assistant:

void NameResolver::ResolveLabelVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        var->set_index(labels_.size() - i - 1);
        return;
      }
    }
    PrintError(&var->loc, "undefined label variable \"%s\"",
               var->name().c_str());
  }
}